

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

void __thiscall
brotli::HashLongestMatchQuickly<16,_1,_true>::InitForData
          (HashLongestMatchQuickly<16,_1,_true> *this,uint8_t *data,size_t num)

{
  size_t i;
  
  for (i = 0; num != i; i = i + 1) {
    this->buckets_[(ulong)(*(long *)(data + i) * 0x1e35a7bd000000) >> 0x30] = 0;
    this->need_init_ = false;
  }
  return;
}

Assistant:

void InitForData(const uint8_t* data, size_t num) {
    for (size_t i = 0; i < num; ++i) {
      const uint32_t key = HashBytes(&data[i]);
      memset(&buckets_[key], 0, kBucketSweep * sizeof(buckets_[0]));
      need_init_ = false;
    }
  }